

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaUtil.c
# Opt level: O3

int Ioa_FileSize(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    puts("Ioa_FileSize(): The file is unavailable (absent or open).");
    iVar1 = 0;
  }
  else {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    iVar1 = (int)lVar2;
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the file size.]

  Description [The file should be closed.]

  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ioa_FileSize( char * pFileName )
{
    FILE * pFile;
    int nFileSize;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Ioa_FileSize(): The file is unavailable (absent or open).\n" );
        return 0;
    }
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile ); 
    fclose( pFile );
    return nFileSize;
}